

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O2

int __thiscall
capnp::SchemaLoader::BrandedInitializerImpl::init(BrandedInitializerImpl *this,EVP_PKEY_CTX *ctx)

{
  Mutex *this_00;
  RawBrandedSchema *pRVar1;
  int extraout_EAX;
  Maybe<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,_capnp::_::RawBrandedSchema_*>::Entry_&>
  MVar2;
  ArrayPtr<const_capnp::_::RawBrandedSchema::Dependency> AVar3;
  Fault f;
  Locked<kj::Own<capnp::SchemaLoader::Impl>_> lock;
  SchemaBindingsPair local_48;
  Locked<kj::Own<capnp::SchemaLoader::Impl>_> local_38;
  Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> local_28;
  
  _::RawSchema::ensureInitialized(*(RawSchema **)ctx);
  this_00 = (Mutex *)this->loader;
  kj::_::Mutex::lock(this_00,EXCLUSIVE);
  local_38.ptr = (Own<capnp::SchemaLoader::Impl> *)(this_00 + 1);
  local_38.mutex = this_00;
  if (*(long *)(ctx + 0x20) != 0) {
    local_48.schema = *(RawSchema **)ctx;
    local_48.scopeBindings = *(Scope **)(ctx + 8);
    MVar2 = kj::
            Table<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,capnp::_::RawBrandedSchema*>::Entry,kj::HashIndex<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,capnp::_::RawBrandedSchema*>::Callbacks>>
            ::find<0ul,capnp::(anonymous_namespace)::SchemaBindingsPair&>
                      ((Table<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,capnp::_::RawBrandedSchema*>::Entry,kj::HashIndex<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,capnp::_::RawBrandedSchema*>::Callbacks>>
                        *)&this_00[1].waitersHead.ptr[5].predicate,&local_48);
    if (MVar2.ptr == (Entry *)0x0) {
      kj::_::Debug::Fault::Fault
                ((Fault *)&local_48,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
                 ,0x793,FAILED,
                 "lock->get()->brands.find(SchemaBindingsPair { schema->generic, schema->scopes }) != nullptr"
                 ,"");
      kj::_::Debug::Fault::fatal((Fault *)&local_48);
    }
    pRVar1 = (MVar2.ptr)->value;
    if (pRVar1 != (RawBrandedSchema *)ctx) {
      kj::_::Debug::Fault::Fault
                ((Fault *)&local_48,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
                 ,0x794,FAILED,"mutableSchema == schema","");
      kj::_::Debug::Fault::fatal((Fault *)&local_48);
    }
    local_28.ptr.field_1.value.ptr = pRVar1->scopes;
    local_28.ptr.field_1.value.size_ = (size_t)pRVar1->scopeCount;
    local_28.ptr.isSet = true;
    AVar3 = Impl::makeBrandedDependencies
                      ((Impl *)((Maybe<kj::_::Mutex::Waiter_&> *)&(local_38.ptr)->ptr)->ptr,
                       pRVar1->generic,&local_28);
    pRVar1->dependencies = AVar3.ptr;
    pRVar1->dependencyCount = (uint32_t)AVar3.size_;
    pRVar1->lazyInitializer = (Initializer *)0x0;
  }
  kj::Locked<kj::Own<capnp::SchemaLoader::Impl>_>::~Locked(&local_38);
  return extraout_EAX;
}

Assistant:

void SchemaLoader::BrandedInitializerImpl::init(const _::RawBrandedSchema* schema) const {
  schema->generic->ensureInitialized();

  auto lock = loader.impl.lockExclusive();

  if (schema->lazyInitializer == nullptr) {
    // Never mind, someone beat us to it.
    return;
  }

  // Get the mutable version.
  _::RawBrandedSchema* mutableSchema = KJ_ASSERT_NONNULL(
      lock->get()->brands.find(SchemaBindingsPair { schema->generic, schema->scopes }));
  KJ_ASSERT(mutableSchema == schema);

  // Construct its dependency map.
  auto deps = lock->get()->makeBrandedDependencies(mutableSchema->generic,
      kj::arrayPtr(mutableSchema->scopes, mutableSchema->scopeCount));
  mutableSchema->dependencies = deps.begin();
  mutableSchema->dependencyCount = deps.size();

  // It's initialized now, so disable the initializer.
#if __GNUC__
  __atomic_store_n(&mutableSchema->lazyInitializer, nullptr, __ATOMIC_RELEASE);
#elif _MSC_VER
  std::atomic_thread_fence(std::memory_order_release);
  *static_cast<_::RawBrandedSchema::Initializer const* volatile*>(
      &mutableSchema->lazyInitializer) = nullptr;
#else
#error "Platform not supported"
#endif
}